

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

bool __thiscall ON_PolyEdgeCurve::IsClosed(ON_PolyEdgeCurve *this)

{
  ON_BrepEdge *this_00;
  ON_BrepEdge *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_PolyEdgeSegment *this_02;
  ON_PolyEdgeSegment *this_03;
  ON_Brep *pOVar4;
  ON_Brep *pOVar5;
  double *pdVar6;
  double t;
  double t_00;
  double dVar7;
  ON_Interval edom1;
  ON_Interval edom0;
  ON_Interval local_50;
  ON_Interval local_40;
  
  bVar1 = ON_PolyCurve::IsClosed(&this->super_ON_PolyCurve);
  bVar2 = true;
  if (!bVar1) {
    iVar3 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
    if (1 < iVar3) {
      this_02 = SegmentCurve(this,0);
      iVar3 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
      this_03 = SegmentCurve(this,iVar3 + -1);
      this_00 = this_02->m_edge;
      if (this_00 == (ON_BrepEdge *)0x0) {
        return false;
      }
      this_01 = this_03->m_edge;
      if (this_01 == (ON_BrepEdge *)0x0) {
        return false;
      }
      pOVar4 = ON_BrepEdge::Brep(this_00);
      pOVar5 = ON_BrepEdge::Brep(this_01);
      if (pOVar4 == pOVar5) {
        bVar1 = ON_PolyEdgeSegment::ReversedEdgeDir(this_02);
        bVar2 = ON_PolyEdgeSegment::ReversedEdgeDir(this_03);
        (*(this_02->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(this_02);
        pdVar6 = ON_Interval::operator[](&local_40,0);
        t = ON_PolyEdgeSegment::EdgeParameter(this_02,*pdVar6);
        (*(this_03->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(this_03);
        pdVar6 = ON_Interval::operator[](&local_40,1);
        t_00 = ON_PolyEdgeSegment::EdgeParameter(this_03,*pdVar6);
        if ((t == -1.23432101234321e+308) && (!NAN(t))) {
          return false;
        }
        if ((t_00 == -1.23432101234321e+308) && (!NAN(t_00))) {
          return false;
        }
        dVar7 = t;
        (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(this_00);
        local_40.m_t[1] = dVar7;
        (*(this_01->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(this_01);
        local_50.m_t[1] = dVar7;
        pdVar6 = ON_Interval::operator[](&local_40,(uint)bVar1);
        if ((t == *pdVar6) && (!NAN(t) && !NAN(*pdVar6))) {
          pdVar6 = ON_Interval::operator[](&local_50,(uint)!bVar2);
          if ((t_00 == *pdVar6) && (!NAN(t_00) && !NAN(*pdVar6))) {
            return this_00->m_vi[bVar1] == this_01->m_vi[(uint)!bVar2];
          }
        }
        if (((this_00 == this_01) && (ABS(t - t_00) <= 2.3283064365386963e-10)) &&
           (bVar1 = ON_Interval::Includes(&local_40,t,true), bVar1)) {
          bVar1 = ON_Interval::Includes(&local_50,t_00,true);
          return bVar1;
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_PolyEdgeCurve::IsClosed(void) const
{
  bool rc = ON_PolyCurve::IsClosed();

  if ( !rc && SegmentCount() > 1 )
  {
    // Since the segments that make up a ON_PolyEdgeCurve
    // cannot have their ends matched (because the curves
    // belong to objects already in the rhino model),
    // the IsClosed() test has to tolerate larger gaps
    // in brep topology.
    //
    // If the start and end segments are edges that belong
    // to the same brep, then they "join" if and only if 
    // they share a vertex.
    const ON_PolyEdgeSegment* seg0 = SegmentCurve(0);
    const ON_PolyEdgeSegment* seg1 = SegmentCurve(SegmentCount()-1);

    const ON_BrepEdge* edge0 = seg0->BrepEdge();
    const ON_BrepEdge* edge1 = seg1->BrepEdge();
    
    if ( edge0 && edge1 && edge0->Brep() == edge1->Brep() )
    {
      // check for topological closure
      //
      // Do NOT add a test for sloppy geometric closure here.
      // If the edges are in the same brep and they don't 
      // meet topologically, then there is something in the
      // brep that is separating the edges.
      int evi0 = seg0->ReversedEdgeDir() ? 1 : 0;
      int evi1 = seg1->ReversedEdgeDir() ? 0 : 1;
      double et0 = seg0->EdgeParameter(seg0->Domain()[0]);
      double et1 = seg1->EdgeParameter(seg1->Domain()[1]);
      if ( et0 != ON_UNSET_VALUE && et1 != ON_UNSET_VALUE )
      {
        ON_Interval edom0 = edge0->Domain();
        ON_Interval edom1 = edge1->Domain();
        if ( et0 == edom0[evi0] && et1 == edom1[evi1] )
        {
          // The polyedge starts at the (evi0?end:start) of edge0
          // and ends at the (ev1?end:start) of edge1.
          if ( edge0->m_vi[evi0] == edge1->m_vi[evi1] )
          {
            // the polyedge start/ends at a common vertex
            rc = true;
          }
        }
        else if ( edge0 == edge1 
                  && fabs(et0-et1) <= ON_ZERO_TOLERANCE 
                  && edom0.Includes(et0,true)
                  && edom1.Includes(et1,true)
                  )
        {
          // The start/end of the polyedge is an interior point
          // of a single edge.  (This happens when the "seam" gets
          // adjusted to be inside of an edge.)  It is unlikely that
          // ON_PolyCurve::IsClosed() would return false in this
          // case, but this check should keep everybody happy.
          rc = true;
        }
      }
    }
  }

  return rc;
}